

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

void lua_len(lua_State *L,int idx)

{
  TValue *rb;
  
  rb = index2addr(L,idx);
  luaV_objlen(L,L->top,rb);
  L->top = L->top + 1;
  return;
}

Assistant:

LUA_API void lua_len(lua_State *L, int idx) {
    StkId t;
    lua_lock(L);
    t = index2addr(L, idx);
    luaV_objlen(L, L->top, t);
    api_incr_top(L);
    lua_unlock(L);
}